

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::set_key_anchor(Tree *this,size_t node,csubstr anchor)

{
  code *pcVar1;
  bool bVar2;
  NodeData *pNVar3;
  basic_substring<const_char> bVar4;
  csubstr anchor_local;
  
  anchor_local.len = anchor.len;
  anchor_local.str = anchor.str;
  pNVar3 = _p(this,node);
  if (((pNVar3->m_type).type & KEYREF) != NOTYPE) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00234578)
              ("check failed: ! is_key_ref(node)",0x20,(anonymous_namespace)::s_default_callbacks);
  }
  bVar4 = basic_substring<const_char>::triml(&anchor_local,'&');
  pNVar3 = _p(this,node);
  (pNVar3->m_key).anchor.str = bVar4.str;
  (pNVar3->m_key).anchor.len = bVar4.len;
  _add_flags(this,node,KEYANCH);
  return;
}

Assistant:

void set_key_anchor(size_t node, csubstr anchor) { RYML_ASSERT( ! is_key_ref(node)); _p(node)->m_key.anchor = anchor.triml('&'); _add_flags(node, KEYANCH); }